

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_huffman_code_lengths(uint *lengths,uint *frequencies,size_t numcodes,uint maxbitlen)

{
  uint uVar1;
  int *piVar2;
  BPMLists *lists_00;
  void *pvVar3;
  void *pvVar4;
  void *pvVar5;
  uint in_ECX;
  ulong in_RDX;
  size_t in_RSI;
  BPMNode *in_RDI;
  BPMNode *node;
  BPMLists lists;
  BPMNode *leaves;
  size_t numpresent;
  uint i;
  uint error;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  size_t in_stack_ffffffffffffff80;
  long lVar6;
  undefined4 in_stack_ffffffffffffff8c;
  long local_38;
  uint local_2c;
  uint local_28;
  uint local_4;
  
  local_28 = 0;
  local_38 = 0;
  if (in_RDX == 0) {
    local_4 = 0x50;
  }
  else if ((uint)(1 << ((byte)in_ECX & 0x1f)) < (uint)in_RDX) {
    local_4 = 0x50;
  }
  else {
    piVar2 = (int *)lodepng_malloc(0x15f802);
    if (piVar2 == (int *)0x0) {
      local_4 = 0x53;
    }
    else {
      for (local_2c = 0; local_2c != in_RDX; local_2c = local_2c + 1) {
        if (*(int *)(in_RSI + (ulong)local_2c * 4) != 0) {
          piVar2[local_38 * 6] = *(int *)(in_RSI + (ulong)local_2c * 4);
          piVar2[local_38 * 6 + 1] = local_2c;
          local_38 = local_38 + 1;
        }
      }
      lodepng_memset(in_RDI,0,in_RDX << 2);
      if (local_38 == 0) {
        in_RDI->index = 1;
        in_RDI->weight = 1;
      }
      else if (local_38 == 1) {
        (&in_RDI->weight)[(uint)piVar2[1]] = 1;
        (&in_RDI->weight)[(int)(uint)(piVar2[1] == 0)] = 1;
      }
      else {
        bpmnode_sort(in_RDI,in_RSI);
        uVar1 = in_ECX * 2 * (in_ECX + 1);
        lists_00 = (BPMLists *)lodepng_malloc(0x15f955);
        pvVar3 = lodepng_malloc(0x15f969);
        pvVar4 = lodepng_malloc(0x15f97d);
        pvVar5 = lodepng_malloc(0x15f991);
        if ((((lists_00 == (BPMLists *)0x0) || (pvVar3 == (void *)0x0)) || (pvVar4 == (void *)0x0))
           || (pvVar5 == (void *)0x0)) {
          local_28 = 0x53;
        }
        if (local_28 == 0) {
          for (local_2c = 0; local_2c != uVar1; local_2c = local_2c + 1) {
            *(uint **)((long)pvVar3 + (ulong)local_2c * 8) =
                 &lists_00->memsize + (ulong)local_2c * 6;
          }
          bpmnode_create((BPMLists *)&stack0xffffffffffffff88,*piVar2,1,(BPMNode *)0x0);
          bpmnode_create((BPMLists *)&stack0xffffffffffffff88,piVar2[6],2,(BPMNode *)0x0);
          for (local_2c = 0; local_2c != in_ECX; local_2c = local_2c + 1) {
            *(BPMLists **)((long)pvVar4 + (ulong)local_2c * 8) = lists_00;
            *(BPMNode ****)((long)pvVar5 + (ulong)local_2c * 8) = &lists_00->freelist;
          }
          for (local_2c = 2; (ulong)local_2c != local_38 * 2 - 2U; local_2c = local_2c + 1) {
            boundaryPM(lists_00,(BPMNode *)CONCAT44(in_stack_ffffffffffffff8c,uVar1),
                       in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78
                      );
          }
          for (lVar6 = *(long *)((long)pvVar5 + (ulong)(in_ECX - 1) * 8); lVar6 != 0;
              lVar6 = *(long *)(lVar6 + 8)) {
            for (local_2c = 0; local_2c != *(uint *)(lVar6 + 4); local_2c = local_2c + 1) {
              (&in_RDI->weight)[(uint)piVar2[(ulong)local_2c * 6 + 1]] =
                   (&in_RDI->weight)[(uint)piVar2[(ulong)local_2c * 6 + 1]] + 1;
            }
          }
        }
        lodepng_free((void *)0x15fb4c);
        lodepng_free((void *)0x15fb56);
        lodepng_free((void *)0x15fb60);
        lodepng_free((void *)0x15fb6a);
      }
      lodepng_free((void *)0x15fb76);
      local_4 = local_28;
    }
  }
  return local_4;
}

Assistant:

unsigned lodepng_huffman_code_lengths(unsigned* lengths, const unsigned* frequencies,
  size_t numcodes, unsigned maxbitlen) {
  unsigned error = 0;
  unsigned i;
  size_t numpresent = 0; /*number of symbols with non-zero frequency*/
  BPMNode* leaves; /*the symbols, only those with > 0 frequency*/

  if (numcodes == 0) return 80; /*error: a tree of 0 symbols is not supposed to be made*/
  if ((1u << maxbitlen) < (unsigned)numcodes) return 80; /*error: represent all symbols*/

  leaves = (BPMNode*)lodepng_malloc(numcodes * sizeof(*leaves));
  if (!leaves) return 83; /*alloc fail*/

  for (i = 0; i != numcodes; ++i) {
    if (frequencies[i] > 0) {
      leaves[numpresent].weight = (int)frequencies[i];
      leaves[numpresent].index = i;
      ++numpresent;
    }
  }

  lodepng_memset(lengths, 0, numcodes * sizeof(*lengths));

  /*ensure at least two present symbols. There should be at least one symbol
  according to RFC 1951 section 3.2.7. Some decoders incorrectly require two. To
  make these work as well ensure there are at least two symbols. The
  Package-Merge code below also doesn't work correctly if there's only one
  symbol, it'd give it the theoretical 0 bits but in practice zlib wants 1 bit*/
  if (numpresent == 0) {
    lengths[0] = lengths[1] = 1; /*note that for RFC 1951 section 3.2.7, only lengths[0] = 1 is needed*/
  }
  else if (numpresent == 1) {
    lengths[leaves[0].index] = 1;
    lengths[leaves[0].index == 0 ? 1 : 0] = 1;
  }
  else {
    BPMLists lists;
    BPMNode* node;

    bpmnode_sort(leaves, numpresent);

    lists.listsize = maxbitlen;
    lists.memsize = 2 * maxbitlen * (maxbitlen + 1);
    lists.nextfree = 0;
    lists.numfree = lists.memsize;
    lists.memory = (BPMNode*)lodepng_malloc(lists.memsize * sizeof(*lists.memory));
    lists.freelist = (BPMNode**)lodepng_malloc(lists.memsize * sizeof(BPMNode*));
    lists.chains0 = (BPMNode**)lodepng_malloc(lists.listsize * sizeof(BPMNode*));
    lists.chains1 = (BPMNode**)lodepng_malloc(lists.listsize * sizeof(BPMNode*));
    if (!lists.memory || !lists.freelist || !lists.chains0 || !lists.chains1) error = 83; /*alloc fail*/

    if (!error) {
      for (i = 0; i != lists.memsize; ++i) lists.freelist[i] = &lists.memory[i];

      bpmnode_create(&lists, leaves[0].weight, 1, 0);
      bpmnode_create(&lists, leaves[1].weight, 2, 0);

      for (i = 0; i != lists.listsize; ++i) {
        lists.chains0[i] = &lists.memory[0];
        lists.chains1[i] = &lists.memory[1];
      }

      /*each boundaryPM call adds one chain to the last list, and we need 2 * numpresent - 2 chains.*/
      for (i = 2; i != 2 * numpresent - 2; ++i) boundaryPM(&lists, leaves, numpresent, (int)maxbitlen - 1, (int)i);

      for (node = lists.chains1[maxbitlen - 1]; node; node = node->tail) {
        for (i = 0; i != node->index; ++i) ++lengths[leaves[i].index];
      }
    }

    lodepng_free(lists.memory);
    lodepng_free(lists.freelist);
    lodepng_free(lists.chains0);
    lodepng_free(lists.chains1);
  }

  lodepng_free(leaves);
  return error;
}